

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  long in_RCX;
  undefined4 in_register_0000003c;
  size_t __n;
  
  if (*(int *)(in_RCX + 0x40) != 0) {
    return 0;
  }
  __n = __nbytes * (long)__buf;
  bVar1 = (long)*(void **)(in_RCX + 0x18) + (__n - *(long *)(in_RCX + 0x10)) <=
          *(ulong *)(in_RCX + 0x30);
  if (bVar1) {
    memcpy((void *)CONCAT44(in_register_0000003c,__fd),*(void **)(in_RCX + 0x18),__n);
    *(long *)(in_RCX + 0x18) = *(long *)(in_RCX + 0x18) + __n;
  }
  return (ulong)bVar1;
}

Assistant:

static int read(void* buf, uint64_t element_size, uint64_t element_count, struct trico_archive* arch)
  {
  if (arch->writable)
    return 0;
  uint64_t sz = element_size * element_count;
  uint64_t data_read = arch->data_pointer - arch->data;
  if ((data_read + sz) > arch->data_size)
    return 0;
  memcpy(buf, arch->data_pointer, sz);
  arch->data_pointer += sz;
  return 1;
  }